

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int trsrch(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double *dx,double maxstep
          ,int iter,double *L,double *hess,double stol,double *ioval,double eps,double *x)

{
  double *vec;
  double *step_00;
  double *xprev_00;
  double dVar1;
  double dVar2;
  double *xprev;
  double *step;
  double *temp;
  double funcprev;
  double t1;
  double nlen;
  double beta;
  double alpha;
  int method;
  int j;
  int i;
  int retval;
  double eps_local;
  double stol_local;
  double maxstep_local;
  double *dx_local;
  double *pdStack_50;
  int N_local;
  double *sN_local;
  double *jac_local;
  double *xi_local;
  custom_function *funcpt_local;
  
  j = 4;
  t1 = 0.0;
  ioval[7] = 1.0;
  alpha._0_4_ = 0;
  _i = eps;
  eps_local = stol;
  stol_local = maxstep;
  maxstep_local = (double)dx;
  dx_local._4_4_ = N;
  pdStack_50 = sN;
  sN_local = jac;
  jac_local = xi;
  xi_local = (double *)funcpt;
  vec = (double *)malloc((long)N << 3);
  step_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  xprev_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  temp = (double *)0x0;
  for (method = 0; method < dx_local._4_4_; method = method + 1) {
    t1 = *(double *)((long)maxstep_local + (long)method * 8) * pdStack_50[method] *
         *(double *)((long)maxstep_local + (long)method * 8) * pdStack_50[method] + t1;
  }
  t1 = sqrt(t1);
  if ((iter == 1) || ((*ioval == -1.0 && (!NAN(*ioval))))) {
    ioval[1] = 0.0;
    for (method = 0; method < dx_local._4_4_; method = method + 1) {
      vec[method] = sN_local[method] / *(double *)((long)maxstep_local + (long)method * 8);
    }
    dVar1 = l2norm(vec,dx_local._4_4_);
    dVar1 = dVar1 * dVar1;
    nlen = 0.0;
    for (method = 0; method < dx_local._4_4_; method = method + 1) {
      funcprev = 0.0;
      for (alpha._4_4_ = method; alpha._4_4_ < dx_local._4_4_; alpha._4_4_ = alpha._4_4_ + 1) {
        funcprev = (L[alpha._4_4_ * dx_local._4_4_ + method] * sN_local[alpha._4_4_]) /
                   (*(double *)((long)maxstep_local + (long)alpha._4_4_ * 8) *
                   *(double *)((long)maxstep_local + (long)alpha._4_4_ * 8)) + funcprev;
      }
      nlen = funcprev * funcprev + nlen;
    }
    beta = dVar1;
    dVar2 = sqrt(dVar1);
    *ioval = (dVar1 * dVar2) / nlen;
    if (stol_local < *ioval) {
      *ioval = stol_local;
    }
  }
  for (; 1 < j && j != 0xf;
      j = trupdate((custom_function *)xi_local,jac_local,sN_local,step_00,dx_local._4_4_,
                   (double *)maxstep_local,stol_local,j,L,hess,eps_local,alpha._0_4_,ioval,xprev_00,
                   (double *)&temp,x)) {
    trstep(sN_local,pdStack_50,dx_local._4_4_,(double *)maxstep_local,L,hess,t1,ioval,_i,step_00);
    ioval[2] = *ioval;
  }
  free(vec);
  free(step_00);
  free(xprev_00);
  return j;
}

Assistant:

int trsrch(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double * dx,double maxstep,
		int iter,double *L,double *hess,double stol,double *ioval,double eps,double *x) {
	int retval,i,j,method;		
	double alpha,beta;
	double nlen,t1,funcprev;
	double *temp,*step,*xprev;
	/*
	 * ioval[0] = delta; [trust region current radius]
	 * ioval[1] = lambda;
	 * ioval[2] = deltaprev; [trust region previous radius]
	 * ioval[3] = phi;
	 * ioval[4] = phi';
	 * ioval[5] = phi_init';
	 * ioval[5] and ioval[6] are "binary" flags.
	 */ 
	retval = 4;
	nlen = 0.0;
	ioval[7] = 1.0;
	method = 0;
	temp = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	xprev = (double*) malloc(sizeof(double) *N);

	funcprev = 0.0;
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * sN[i] * dx[i] * sN[i];
	}
	nlen = sqrt(nlen);
	if (iter == 1 || ioval[0] == -1) {
		ioval[1] = 0.;
		for (i = 0; i < N;++i) {
			temp[i] = jac[i] / dx[i];
		}
		alpha = l2norm(temp,N);
		alpha = alpha*alpha;
		
		beta = 0;
		for(i = 0; i < N;++i) {
			t1 = 0.;
			for(j = i; j < N;++j) {
				t1+= L[j*N+i]*jac[j]/(dx[j] * dx[j]);
			}
			beta += t1*t1;
		}
		ioval[0] = alpha * sqrt(alpha) / beta;
		
		if (ioval[0] > maxstep) {
			ioval[0] = maxstep;
		}
	}
	
	while (retval >= 2 && retval != 15) {
		trstep(jac,sN,N,dx,L,hess,nlen,ioval,eps,step);
		ioval[2] = ioval[0];
		retval = trupdate(funcpt,xi,jac,step,N,dx,maxstep,retval,L,hess,stol,method,ioval,xprev,&funcprev,x);
	}
	 
	free(temp); 
	free(step);
	free(xprev);
	return retval;

}